

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

void __thiscall Fl_Help_View::add_target(Fl_Help_View *this,char *n,int yy)

{
  int iVar1;
  Fl_Help_Target *pFVar2;
  int iVar3;
  
  iVar3 = this->ntargets_;
  iVar1 = this->atargets_;
  if (iVar3 < iVar1) {
    pFVar2 = this->targets_;
  }
  else {
    this->atargets_ = (int)((long)iVar1 + 0x10);
    if (iVar1 == 0) {
      pFVar2 = (Fl_Help_Target *)malloc(0x240);
      this->targets_ = pFVar2;
    }
    else {
      pFVar2 = (Fl_Help_Target *)realloc(this->targets_,((long)iVar1 + 0x10) * 0x24);
      this->targets_ = pFVar2;
      iVar3 = this->ntargets_;
    }
  }
  pFVar2[iVar3].y = yy;
  fl_strlcpy(pFVar2[iVar3].name,n,0x20);
  this->ntargets_ = this->ntargets_ + 1;
  return;
}

Assistant:

void Fl_Help_View::add_target(const char *n,	// I - Name of target
			      int        yy)	// I - Y position of target
{
  Fl_Help_Target	*temp;			// New target


  if (ntargets_ >= atargets_)
  {
    atargets_ += 16;

    if (atargets_ == 16)
      targets_ = (Fl_Help_Target *)malloc(sizeof(Fl_Help_Target) * atargets_);
    else
      targets_ = (Fl_Help_Target *)realloc(targets_, sizeof(Fl_Help_Target) * atargets_);
  }

  temp = targets_ + ntargets_;

  temp->y = yy;
  strlcpy(temp->name, n, sizeof(temp->name));

  ntargets_ ++;
}